

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFilter.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::ArgumentListParser::parse_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,void *this,istream *is)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  char *in_RCX;
  void *pvVar4;
  bool bVar5;
  undefined1 local_58 [8];
  string word;
  char c;
  istream *is_local;
  ArgumentListParser *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  cVar1 = cali::util::read_char(is);
  if (cVar1 == '(') {
    do {
      cali::util::read_word_abi_cxx11_((string *)local_58,(util *)is,(istream *)",()",in_RCX);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      }
      cVar1 = cali::util::read_char(is);
      std::__cxx11::string::~string((string *)local_58);
      bVar5 = false;
      in_RCX = (char *)this;
      if ((*(byte *)((long)this + 0x20) & 1) == 0) {
        pvVar4 = this;
        bVar2 = std::ios::good();
        in_RCX = (char *)CONCAT71((int7)((ulong)pvVar4 >> 8),bVar2);
        bVar5 = false;
        if ((bVar2 & 1) != 0) {
          bVar5 = cVar1 == ',';
        }
      }
    } while (bVar5);
    if (cVar1 != ')') {
      *(undefined1 *)((long)this + 0x20) = 1;
      std::__cxx11::string::operator=((string *)this,"missing \')\'");
    }
  }
  else {
    std::istream::unget();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> parse(std::istream& is)
    {
        std::vector<std::string> ret;
        char                     c = util::read_char(is);

        if (c != '(') {
            is.unget();
            return ret;
        }

        do {
            std::string word = util::read_word(is, ",()");

            if (!word.empty())
                ret.emplace_back(std::move(word));

            c = util::read_char(is);
        } while (!m_error && is.good() && c == ',');

        if (c != ')') {
            m_error     = true;
            m_error_msg = "missing \')\'";
        }

        return ret;
    }